

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.H
# Opt level: O1

void __thiscall
amrex::ForkJoin::reg_mf_vec
          (ForkJoin *this,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *mfs,
          string *name,Strategy strategy,Intent intent,int owner)

{
  pointer ppMVar1;
  vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_> *this_00;
  pointer ppMVar2;
  long lVar3;
  
  this_00 = &std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->data,name)->
             super_vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>;
  std::vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>::reserve
            (this_00,(long)(mfs->
                           super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                           ).
                           super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(mfs->
                           super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                           ).
                           super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppMVar2 = (mfs->super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
            super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppMVar1 = (mfs->super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
            super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar1 != ppMVar2 && -1 < (long)ppMVar1 - (long)ppMVar2) {
    lVar3 = 0;
    do {
      reg_mf(this,ppMVar2[lVar3],name,(int)lVar3,strategy,intent,owner);
      lVar3 = lVar3 + 1;
      ppMVar2 = (mfs->
                super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar3 < (long)(mfs->
                           super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                           ).
                           super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2 >> 3);
  }
  return;
}

Assistant:

void reg_mf_vec (const Vector<MultiFab const *> &mfs, const std::string &name,
                     Strategy strategy, Intent intent, int owner = -1) {
        data[name].reserve(mfs.size());
        for (int i = 0; i < mfs.size(); ++i) {
            reg_mf(*mfs[i], name, i, strategy, intent, owner);
        }
    }